

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O3

string * __thiscall
oout::FmtText::success(string *__return_storage_ptr__,FmtText *this,string *text)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[       OK ] ",0xd);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string success(const string &text) const override
	{
		ostringstream out;
		out << text << endl << "[       OK ] ";
		return out.str();
	}